

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O1

void __thiscall
Js::ExternalArrayBuffer::ExtractSnapObjectDataInto
          (ExternalArrayBuffer *this,SnapObject *objData,SlabAllocator *alloc)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  uchar *__dest;
  undefined4 extraout_var;
  
  puVar3 = (uint *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  uVar1 = (*(this->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x71])(this);
  *puVar3 = uVar1;
  if (uVar1 == 0) {
    puVar3[2] = 0;
    puVar3[3] = 0;
  }
  else {
    __dest = TTD::SlabAllocatorBase<0>::SlabAllocateArray<unsigned_char>(alloc,(ulong)uVar1);
    *(uchar **)(puVar3 + 2) = __dest;
    iVar2 = (*(this->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(this);
    memcpy(__dest,(void *)CONCAT44(extraout_var,iVar2),(ulong)*puVar3);
  }
  if (objData->SnapObjectTag == SnapArrayBufferObject) {
    objData->AddtlSnapObjectInfo = puVar3;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void ExternalArrayBuffer::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapArrayBufferInfo* sabi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapArrayBufferInfo>();

        sabi->Length = this->GetByteLength();
        if(sabi->Length == 0)
        {
            sabi->Buff = nullptr;
        }
        else
        {
            sabi->Buff = alloc.SlabAllocateArray<byte>(sabi->Length);
            memcpy(sabi->Buff, this->GetBuffer(), sabi->Length);
        }

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapArrayBufferInfo*, TTD::NSSnapObjects::SnapObjectType::SnapArrayBufferObject>(objData, sabi);
    }